

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,uint id,int width,int height)

{
  int iVar1;
  ImFontAtlasCustomRect *pIVar2;
  ImFontAtlasCustomRect *pIVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = (this->CustomRects).Size;
  iVar1 = (this->CustomRects).Capacity;
  if (iVar5 == iVar1) {
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      pIVar3 = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar5 << 5);
      pIVar2 = (this->CustomRects).Data;
      if (pIVar2 != (ImFontAtlasCustomRect *)0x0) {
        memcpy(pIVar3,pIVar2,(long)(this->CustomRects).Size << 5);
        ImGui::MemFree((this->CustomRects).Data);
      }
      (this->CustomRects).Data = pIVar3;
      (this->CustomRects).Capacity = iVar5;
    }
  }
  pIVar2 = (this->CustomRects).Data;
  iVar5 = (this->CustomRects).Size;
  pIVar2[iVar5].ID = id;
  pIVar2[iVar5].Width = (unsigned_short)width;
  pIVar2[iVar5].Height = (unsigned_short)height;
  pIVar2[iVar5].X = 0xffff;
  pIVar2[iVar5].Y = 0xffff;
  pIVar3 = pIVar2 + iVar5;
  pIVar3->GlyphAdvanceX = 0.0;
  (pIVar3->GlyphOffset).x = 0.0;
  *(undefined8 *)(&pIVar3->GlyphAdvanceX + 2) = 0;
  *(undefined4 *)((long)&pIVar2[iVar5].Font + 4) = 0;
  iVar5 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar5 + 1;
  return iVar5;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(unsigned int id, int width, int height)
{
    // Breaking change on 2019/11/21 (1.74): ImFontAtlas::AddCustomRectRegular() now requires an ID >= 0x110000 (instead of >= 0x10000)
    IM_ASSERT(id >= 0x110000);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}